

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_func_op_cast_clustered
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type)

{
  uint32_t result_id_00;
  bool forwarding;
  SPIRType *pSVar1;
  SPIRType *pSVar2;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  uint32_t result_type_00;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  string expr;
  undefined1 local_1a0 [8];
  string cast_op0;
  SPIRType expected_type;
  SPIRType *out_type;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  out_type = (SPIRType *)op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  SPIRType::SPIRType((SPIRType *)((long)&cast_op0.field_2 + 8),pSVar1);
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op_local._4_4_);
  if (pSVar2->basetype == input_type) {
    to_unpacked_expression_abi_cxx11_((string *)local_1a0,this,op_local._4_4_,true);
  }
  else {
    bitcast_glsl_abi_cxx11_
              ((string *)local_1a0,this,(SPIRType *)((long)&cast_op0.field_2 + 8),op_local._4_4_);
  }
  ::std::__cxx11::string::string((string *)local_1d0);
  if (pSVar1->basetype == input_type) {
    to_expression_abi_cxx11_(&local_270,this,(uint32_t)op_local,true);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_250,(spirv_cross *)&out_type,(char **)0x4a488c,(char (*) [2])local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])&local_270,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    ::std::__cxx11::string::operator+=((string *)local_1d0,(string *)&local_250);
    ::std::__cxx11::string::~string((string *)&local_250);
    ::std::__cxx11::string::~string((string *)&local_270);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x3b])
              (local_1f0,this,pSVar1,(undefined1 *)((long)&cast_op0.field_2 + 8));
    ::std::__cxx11::string::operator=((string *)local_1d0,local_1f0);
    ::std::__cxx11::string::~string(local_1f0);
    ::std::__cxx11::string::operator+=((string *)local_1d0,'(');
    to_expression_abi_cxx11_(&local_230,this,(uint32_t)op_local,true);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_210,(spirv_cross *)&out_type,(char **)0x4a488c,(char (*) [2])local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])&local_230,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    ::std::__cxx11::string::operator+=((string *)local_1d0,(string *)&local_210);
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::__cxx11::string::~string((string *)&local_230);
    ::std::__cxx11::string::operator+=((string *)local_1d0,')');
  }
  result_id_00 = op1_local;
  result_type_00 = op0_local;
  forwarding = should_forward(this,op_local._4_4_);
  emit_op(this,result_type_00,result_id_00,(string *)local_1d0,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op_local._4_4_);
  ::std::__cxx11::string::~string((string *)local_1d0);
  ::std::__cxx11::string::~string((string *)local_1a0);
  SPIRType::~SPIRType((SPIRType *)((long)&cast_op0.field_2 + 8));
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op_cast_clustered(uint32_t result_type, uint32_t result_id, uint32_t op0,
                                                      uint32_t op1, const char *op, SPIRType::BaseType input_type)
{
	// Special purpose method for implementing clustered subgroup opcodes.
	// Main difference is that op1 does not participate in any casting, it needs to be a literal.
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type;
	string cast_op0 =
	    expression_type(op0).basetype != input_type ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != input_type)
	{
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", to_expression(op1), ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", to_expression(op1), ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}